

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O2

int Gia_MuxStructDump(Gia_Man_t *p,int iObj,Vec_Str_t *vStr,int nDigitsNum,int nDigitsId)

{
  int Num;
  int iVar1;
  
  if ((p->pMuxes != (uint *)0x0) && (p->pMuxes[iObj] != 0)) {
    Num = Gia_MuxDeref(p,iObj);
    vStr->nSize = 0;
    Vec_StrPrintNumStar(vStr,Num,nDigitsNum);
    Gia_MuxStructDump_rec(p,iObj,1,vStr,nDigitsId);
    Vec_StrPush(vStr,'\0');
    iVar1 = Gia_MuxRef(p,iObj);
    if (Num == iVar1) {
      return Num;
    }
    __assert_fail("Count1 == Count2",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaMuxes.c"
                  ,0x185,"int Gia_MuxStructDump(Gia_Man_t *, int, Vec_Str_t *, int, int)");
  }
  __assert_fail("Gia_ObjIsMuxId(p, iObj)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaMuxes.c"
                ,0x17e,"int Gia_MuxStructDump(Gia_Man_t *, int, Vec_Str_t *, int, int)");
}

Assistant:

int Gia_MuxStructDump( Gia_Man_t * p, int iObj, Vec_Str_t * vStr, int nDigitsNum, int nDigitsId )
{
    int Count1, Count2;
    assert( Gia_ObjIsMuxId(p, iObj) );
    Count1 = Gia_MuxDeref( p, iObj );
    Vec_StrClear( vStr );
    Vec_StrPrintNumStar( vStr, Count1, nDigitsNum );
    Gia_MuxStructDump_rec( p, iObj, 1, vStr, nDigitsId );
    Vec_StrPush( vStr, '\0' );
    Count2 = Gia_MuxRef( p, iObj );
    assert( Count1 == Count2 );
    return Count1;
}